

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniqueid_linux.c
# Opt level: O3

UNIQUEID_RESULT UniqueId_Generate(char *uid,size_t len)

{
  LOGGER_LOG p_Var1;
  UNIQUEID_RESULT UVar2;
  uuid_t uuidVal;
  
  if (uid == (char *)0x0 || len < 0x25) {
    p_Var1 = xlogging_get_log_function();
    UVar2 = UNIQUEID_INVALID_ARG;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/uniqueid_linux.c"
                ,"UniqueId_Generate",0x18,1,"Buffer Size is Null. (result = %s%s (%d))","",
                UNIQUEID_RESULTStringStorage[2],2);
    }
  }
  else {
    uuid_generate(uuidVal);
    memset(uid,0,len);
    uuid_unparse(uuidVal,uid);
    UVar2 = UNIQUEID_OK;
  }
  return UVar2;
}

Assistant:

UNIQUEID_RESULT UniqueId_Generate(char* uid, size_t len)
{
    UNIQUEID_RESULT result;

    /* Codes_SRS_UNIQUEID_07_002: [If uid is NULL then UniqueId_Generate shall return UNIQUEID_INVALID_ARG] */
    /* Codes_SRS_UNIQUEID_07_003: [If len is less then 37 then UniqueId_Generate shall return UNIQUEID_INVALID_ARG] */
    if (uid == NULL || len < 37)
    {
        result = UNIQUEID_INVALID_ARG;
        LogError("Buffer Size is Null. (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(UNIQUEID_RESULT, result));
    }
    else
    {
        uuid_t uuidVal;
        uuid_generate(uuidVal);

        /* Codes_SRS_UNIQUEID_07_001: [UniqueId_Generate shall create a unique Id 36 character long string.] */
        memset(uid, 0, len);
        uuid_unparse(uuidVal, uid);
        result = UNIQUEID_OK;
    }
    return result;
}